

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyvalues.cpp
# Opt level: O2

bool __thiscall KV::KeyValues::getValueAsBool(KeyValues *this,bool defaultVal)

{
  int iVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  
  if ((this->value).
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged == true) {
    __str = std::
            optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::value(&this->value);
    iVar1 = std::__cxx11::stoi(__str,(size_t *)0x0,10);
    defaultVal = iVar1 != 0;
  }
  return defaultVal;
}

Assistant:

bool KeyValues::getValueAsBool( bool defaultVal /*= false*/ ) const
	{
		if ( !value )
			return defaultVal;

		try
		{
			return ( std::stoi( value.value() ) != 0 );
		}
		catch ( const std::exception& )
		{
			return defaultVal;
		}
	}